

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int i4_gcd(int i,int j)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (i == 0) {
    iVar2 = -j;
    if (0 < j) {
      iVar2 = j;
    }
  }
  else {
    iVar2 = -i;
    if (0 < i) {
      iVar2 = i;
    }
    if (j != 0) {
      iVar3 = -j;
      if (0 < j) {
        iVar3 = j;
      }
      iVar1 = i4_max(iVar2,iVar3);
      iVar2 = i4_min(iVar2,iVar3);
      do {
        iVar3 = iVar2;
        iVar2 = iVar1 % iVar3;
        iVar1 = iVar3;
      } while (iVar2 != 0);
      return iVar3;
    }
  }
  iVar2 = i4_max(1,iVar2);
  return iVar2;
}

Assistant:

int i4_gcd ( int i, int j )

//****************************************************************************80
//
//  Purpose:
//
//    I4_GCD finds the greatest common divisor of two I4's.
//
//  Discussion:
//
//    Only the absolute values of I and J are
//    considered, so that the result is always nonnegative.
//
//    If I or J is 0, I4_GCD is returned as max ( 1, abs ( I ), abs ( J ) ).
//
//    If I and J have no common factor, I4_GCD is returned as 1.
//
//    Otherwise, using the Euclidean algorithm, I4_GCD is the
//    largest common factor of I and J.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int I, J, two numbers whose greatest common divisor
//    is desired.
//
//    Output, int I4_GCD, the greatest common divisor of I and J.
//
{
  int ip;
  int iq;
  int ir;
//
//  Return immediately if either I or J is zero.
//
  if ( i == 0 )
  {
    return i4_max ( 1, abs ( j ) );
  }
  else if ( j == 0 )
  {
    return i4_max ( 1, abs ( i ) );
  }
//
//  Set IP to the larger of I and J, IQ to the smaller.
//  This way, we can alter IP and IQ as we go.
//
  ip = i4_max ( abs ( i ), abs ( j ) );
  iq = i4_min ( abs ( i ), abs ( j ) );
//
//  Carry out the Euclidean algorithm.
//
  for ( ; ; )
  {
    ir = ip % iq;

    if ( ir == 0 )
    {
      break;
    }

    ip = iq;
    iq = ir;
  }

  return iq;
}